

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

bool absl::(anonymous_namespace)::Base64UnescapeInternal<std::__cxx11::string>
               (Nullable<const_char_*> src,size_t slen,
               Nonnull<std::__cxx11::basic_string<char>_*> dest,
               Nonnull<const_signed_char_*> unbase64)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  pointer pcVar9;
  byte bVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  ulong local_50;
  
  uVar18 = slen - (slen >> 2);
  std::__cxx11::string::resize((ulong)dest,(char)uVar18);
  pcVar9 = (dest->_M_dataplus)._M_p;
  if (pcVar9 == (pointer)0x0) {
    if (3 < slen) {
      uVar6 = 0;
      uVar13 = 0;
      uVar7 = 0;
      uVar8 = 0;
      pbVar19 = (byte *)src;
LAB_0027385b:
      if (((((ulong)*pbVar19 == 0) || ((ulong)pbVar19[1] == 0)) || ((ulong)pbVar19[2] == 0)) ||
         (uVar6 = (int)unbase64[pbVar19[3]] |
                  (int)unbase64[pbVar19[2]] << 6 |
                  (int)unbase64[pbVar19[1]] << 0xc | (int)unbase64[*pbVar19] << 0x12, (int)uVar6 < 0
         )) {
        uVar13 = slen - 2;
        uVar4 = slen - 3;
        uVar16 = slen - 4;
        uVar14 = 0;
        sVar12 = slen;
        src = (Nullable<const_char_*>)pbVar19;
LAB_002738d5:
        bVar10 = *src;
        uVar7 = (uint)unbase64[bVar10];
        if (unbase64[bVar10] < '\0') {
          sVar12 = sVar12 - 1;
          src = (Nullable<const_char_*>)((byte *)src + 1);
          if (((&ascii_internal::kPropertyBits)[bVar10] & 8) != 0) goto code_r0x002738fd;
          goto LAB_00273a14;
        }
        goto LAB_0027391e;
      }
      slen = slen - 4;
      src = (Nullable<const_char_*>)(pbVar19 + 4);
      goto LAB_002739d9;
    }
  }
  else if (3 < slen) {
    uVar13 = 0;
    uVar7 = 0;
    local_50 = 0;
    sVar12 = slen;
    pbVar19 = (byte *)src;
    uVar5 = 0;
LAB_0027368f:
    if (((((ulong)*pbVar19 == 0) || ((ulong)pbVar19[1] == 0)) || ((ulong)pbVar19[2] == 0)) ||
       (uVar5 = (int)unbase64[pbVar19[3]] |
                (int)unbase64[pbVar19[2]] << 6 |
                (int)unbase64[pbVar19[1]] << 0xc | (int)unbase64[*pbVar19] << 0x12, (int)uVar5 < 0))
    {
      uVar13 = sVar12 - 4;
      lVar17 = -2;
      uVar4 = 0;
      slen = sVar12;
      src = (Nullable<const_char_*>)pbVar19;
LAB_002736fe:
      bVar10 = *src;
      uVar7 = (uint)unbase64[bVar10];
      uVar8 = local_50;
      if (unbase64[bVar10] < '\0') {
        slen = slen - 1;
        src = (Nullable<const_char_*>)((byte *)src + 1);
        if (((&ascii_internal::kPropertyBits)[bVar10] & 8) != 0) goto code_r0x00273720;
        goto LAB_00273a02;
      }
      goto LAB_00273751;
    }
    slen = sVar12 - 4;
    src = (Nullable<const_char_*>)(pbVar19 + 4);
    goto LAB_002737f4;
  }
  uVar7 = 0;
  uVar3 = 0;
  bVar10 = 0;
  uVar8 = 0;
  uVar6 = 0;
LAB_00273a83:
  if ((int)uVar7 < 0) {
    if ((bVar10 == 0x2e) || (bVar10 == 0x3d)) goto LAB_00273b4e;
    if (((&ascii_internal::kPropertyBits)[bVar10] & 8) != 0) goto LAB_00273a93;
switchD_00273b6d_caseD_1:
    uVar3 = 0;
  }
  else {
LAB_00273a93:
    if ((bVar10 != 0x2e) && (bVar10 != 0x3d)) {
      do {
        do {
          pbVar19 = (byte *)src;
          uVar4 = slen;
          uVar13 = 0;
          while( true ) {
            uVar16 = uVar13;
            if (uVar4 == uVar16) {
              pbVar20 = pbVar19 + uVar4;
              lVar17 = 0;
              goto LAB_00273b54;
            }
            uVar14 = (ulong)pbVar19[uVar16];
            if (-1 < unbase64[uVar14]) break;
            uVar13 = uVar16 + 1;
            if (((&ascii_internal::kPropertyBits)[uVar14] & 8) == 0) {
              pbVar20 = pbVar19 + uVar16;
              lVar17 = (uVar4 - (uVar16 + 1)) + 1;
              if ((uVar14 == 0x2e) || (pbVar19[uVar16] == 0x3d)) goto LAB_00273b54;
              goto switchD_00273b6d_caseD_1;
            }
          }
          uVar7 = uVar6 << 6;
          uVar6 = (int)unbase64[uVar14] | uVar7;
          uVar3 = uVar3 + 1;
          slen = uVar4 + ~uVar16;
          src = (Nullable<const_char_*>)(pbVar19 + uVar16 + 1);
        } while (uVar3 != 4);
        if (pcVar9 != (pointer)0x0) {
          if (uVar18 < uVar8 + 3) goto switchD_00273b6d_caseD_1;
          pcVar9[uVar8 + 2] = (char)uVar6;
          pcVar9[uVar8 + 1] = (char)(uVar7 >> 8);
          pcVar9[uVar8] = (char)(uVar7 >> 0x10);
        }
        uVar8 = uVar8 + 3;
        uVar3 = 0;
        uVar6 = 0;
        slen = ~uVar16 + uVar4;
        src = (Nullable<const_char_*>)(pbVar19 + uVar16 + 1);
      } while( true );
    }
LAB_00273b4e:
    lVar17 = slen + 1;
    pbVar20 = (byte *)src + -1;
LAB_00273b54:
    switch(uVar3) {
    case 0:
      uVar6 = 0xffffffff;
      break;
    case 1:
      goto switchD_00273b6d_caseD_1;
    case 2:
      if (pcVar9 != (pointer)0x0) {
        if (uVar18 < uVar8 + 1) goto switchD_00273b6d_caseD_1;
        pcVar9[uVar8] = (char)(uVar6 >> 4);
      }
      uVar8 = uVar8 + 1;
      uVar6 = 0xfffffffd;
      break;
    case 3:
      if (pcVar9 != (pointer)0x0) {
        if (uVar18 < uVar8 + 2) goto switchD_00273b6d_caseD_1;
        pcVar9[uVar8 + 1] = (char)(uVar6 >> 2);
        pcVar9[uVar8] = (char)(uVar6 >> 10);
      }
      uVar8 = uVar8 + 2;
      uVar6 = 0xfffffffe;
      break;
    default:
      raw_log_internal::RawLog
                (kFatal,"escaping.cc",0x2ad,"This can\'t happen; base64 decoder state = %d",
                 (ulong)uVar3);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                    ,0x2ad,
                    "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nullable<char *>, size_t, absl::Nonnull<const signed char *>, absl::Nonnull<size_t *>)"
                   );
    }
    if (lVar17 == 0) {
      uVar7 = 0;
    }
    else {
      lVar11 = 0;
      uVar7 = 0;
      do {
        bVar10 = pbVar20[lVar11];
        if ((bVar10 == 0x3d) || (bVar10 == 0x2e)) {
          uVar7 = uVar7 + 1;
        }
        else if (((&ascii_internal::kPropertyBits)[bVar10] & 8) == 0) goto switchD_00273b6d_caseD_1;
        lVar11 = lVar11 + 1;
      } while (lVar17 != lVar11);
    }
    uVar3 = (uint)((uVar7 & uVar6) == 0);
  }
LAB_00273c51:
  if (SUB41(uVar3,0) == false) {
    dest->_M_string_length = 0;
    pcVar9 = (dest->_M_dataplus)._M_p;
  }
  else {
    if (uVar18 < uVar8) {
      __assert_fail("len <= dest_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                    ,0x341,
                    "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nonnull<String *>, absl::Nonnull<const signed char *>) [String = std::basic_string<char>]"
                   );
    }
    if (dest->_M_string_length < uVar8) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    dest->_M_string_length = uVar8;
    pcVar9 = (dest->_M_dataplus)._M_p + uVar8;
  }
  *pcVar9 = '\0';
  return SUB41(uVar3,0);
code_r0x002738fd:
  uVar14 = uVar14 + 1;
  uVar13 = uVar13 - 1;
  uVar4 = uVar4 - 1;
  uVar16 = uVar16 - 1;
  if (sVar12 < 4) {
LAB_00273a14:
    uVar3 = 0;
    slen = sVar12;
    goto LAB_00273a83;
  }
  goto LAB_002738d5;
LAB_0027391e:
  uVar15 = uVar14;
  bVar10 = pbVar19[uVar15 + 1];
  uVar7 = (uint)unbase64[bVar10];
  if (unbase64[bVar10] < '\0') {
    if (((&ascii_internal::kPropertyBits)[bVar10] & 8) != 0) goto code_r0x00273946;
    goto LAB_00273a43;
  }
  src = (Nullable<const_char_*>)(pbVar19 + uVar15 + 2);
  while( true ) {
    slen = uVar4;
    bVar10 = *src;
    uVar7 = (uint)unbase64[bVar10];
    if (-1 < unbase64[bVar10]) break;
    src = (Nullable<const_char_*>)((byte *)src + 1);
    if ((((&ascii_internal::kPropertyBits)[bVar10] & 8) == 0) ||
       (uVar16 = uVar16 - 1, uVar4 = slen - 1, slen < 2)) {
      uVar3 = 2;
      goto LAB_00273a83;
    }
  }
  src = (Nullable<const_char_*>)((byte *)src + 1);
  while( true ) {
    slen = uVar16;
    bVar10 = *src;
    uVar13 = (ulong)bVar10;
    src = (Nullable<const_char_*>)((byte *)src + 1);
    uVar7 = (uint)unbase64[uVar13];
    if (-1 < unbase64[uVar13]) break;
    if ((((&ascii_internal::kPropertyBits)[uVar13] & 8) == 0) || (uVar16 = slen - 1, slen == 0)) {
      uVar3 = 3;
      goto LAB_00273a83;
    }
  }
LAB_002739d9:
  bVar10 = (byte)uVar13;
  uVar8 = uVar8 + 3;
  uVar3 = 0;
  pbVar19 = (byte *)src;
  if (slen < 4) goto LAB_00273a83;
  goto LAB_0027385b;
code_r0x00273946:
  uVar4 = uVar4 - 1;
  uVar16 = uVar16 - 1;
  bVar2 = uVar13 < 3;
  uVar14 = uVar15 + 1;
  uVar13 = uVar13 - 1;
  if (bVar2) {
LAB_00273a43:
    src = (Nullable<const_char_*>)(pbVar19 + uVar15 + 2);
    slen = ~(uVar15 + 1) + slen;
    uVar3 = 1;
    goto LAB_00273a83;
  }
  goto LAB_0027391e;
code_r0x00273720:
  uVar4 = uVar4 + 1;
  lVar17 = lVar17 + -1;
  uVar13 = uVar13 - 1;
  if (slen < 4) {
LAB_00273a02:
    uVar3 = 0;
    uVar6 = uVar5;
    goto LAB_00273a83;
  }
  goto LAB_002736fe;
LAB_00273751:
  uVar16 = uVar4;
  slen = lVar17 + sVar12;
  bVar10 = pbVar19[uVar16 + 1];
  cVar1 = unbase64[bVar10];
  if (cVar1 < '\0') {
    if (((&ascii_internal::kPropertyBits)[bVar10] & 8) != 0) goto code_r0x00273741;
    goto LAB_00273a28;
  }
  uVar6 = uVar7 << 6 | (int)cVar1;
  src = (Nullable<const_char_*>)(pbVar19 + uVar16 + 2);
  while( true ) {
    bVar10 = *src;
    src = (Nullable<const_char_*>)((byte *)src + 1);
    cVar1 = unbase64[bVar10];
    if (-1 < cVar1) break;
    slen = slen - 1;
    if ((((&ascii_internal::kPropertyBits)[bVar10] & 8) == 0) || (uVar13 = uVar13 - 1, slen < 2)) {
      uVar3 = 2;
      uVar7 = (int)cVar1;
      goto LAB_00273a83;
    }
  }
  uVar6 = uVar6 << 6 | (int)cVar1;
  while( true ) {
    slen = uVar13;
    bVar10 = *src;
    uVar13 = (ulong)bVar10;
    src = (Nullable<const_char_*>)((byte *)src + 1);
    uVar7 = (uint)unbase64[uVar13];
    if (-1 < unbase64[uVar13]) break;
    if ((((&ascii_internal::kPropertyBits)[uVar13] & 8) == 0) || (uVar13 = slen - 1, slen == 0)) {
      uVar3 = 3;
      goto LAB_00273a83;
    }
  }
  uVar5 = uVar6 << 6 | uVar7;
LAB_002737f4:
  bVar10 = (byte)uVar13;
  uVar8 = local_50 + 3;
  uVar3 = 0;
  if (uVar18 < uVar8) goto LAB_00273c51;
  *(ushort *)(pcVar9 + local_50 + 1) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
  uVar6 = uVar5 >> 0x10;
  pcVar9[local_50] = (char)(uVar5 >> 0x10);
  sVar12 = slen;
  pbVar19 = (byte *)src;
  uVar5 = uVar6;
  local_50 = uVar8;
  if (slen < 4) goto LAB_00273a83;
  goto LAB_0027368f;
code_r0x00273741:
  lVar17 = lVar17 + -1;
  uVar13 = uVar13 - 1;
  uVar4 = uVar16 + 1;
  if (slen < 3) {
LAB_00273a28:
    src = (Nullable<const_char_*>)(pbVar19 + uVar16 + 2);
    uVar3 = 1;
    slen = sVar12 + ~(uVar16 + 1);
    uVar6 = uVar7;
    uVar7 = (int)cVar1;
    goto LAB_00273a83;
  }
  goto LAB_00273751;
}

Assistant:

bool Base64UnescapeInternal(absl::Nullable<const char*> src, size_t slen,
                            absl::Nonnull<String*> dest,
                            absl::Nonnull<const signed char*> unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  Any leftover chars are added directly for good measure.
  const size_t dest_len = 3 * (slen / 4) + (slen % 4);

  strings_internal::STLStringResizeUninitialized(dest, dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  size_t len;
  const bool ok =
      Base64UnescapeInternal(src, slen, &(*dest)[0], dest_len, unbase64, &len);
  if (!ok) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  assert(len <= dest_len);
  dest->erase(len);

  return true;
}